

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_stack.c
# Opt level: O0

DS_STATUS ds_stack_push(DsStack *stack,void *data)

{
  int iVar1;
  void *data_local;
  DsStack *stack_local;
  
  if (stack == (DsStack *)0x0) {
    stack_local._4_4_ = DS_STATUS_NULL;
  }
  else if ((ulong)(long)stack->index < stack->max) {
    iVar1 = stack->index;
    stack->index = iVar1 + 1;
    stack->elems[iVar1] = data;
    stack_local._4_4_ = DS_STATUS_OK;
  }
  else {
    stack_local._4_4_ = DS_STATUS_FULL;
  }
  return stack_local._4_4_;
}

Assistant:

DS_STATUS ds_stack_push(DsStack *stack, void *data)
{
    if (NULL == stack)
        return DS_STATUS_NULL;
    if (stack->index >= stack->max)
        return DS_STATUS_FULL;
    stack->elems[stack->index++] = data;
    return DS_STATUS_OK;
}